

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O1

void non_existing_opendir_cb(uv_fs_t *req)

{
  char *__s1;
  int iVar1;
  uv_fs_t *puVar2;
  uv_fs_t *puVar3;
  undefined8 uVar4;
  long lVar5;
  undefined1 auStack_8f0 [440];
  uv_fs_t *puStack_738;
  undefined1 auStack_728 [440];
  uv_fs_t uStack_570;
  undefined1 auStack_3b8 [440];
  undefined1 auStack_200 [440];
  uv_fs_t *puStack_48;
  
  if (req == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015a954;
    if (opendir_req.result != -2) goto LAB_0015a959;
    if (opendir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&opendir_req);
      non_existing_opendir_cb_count = non_existing_opendir_cb_count + 1;
      return;
    }
  }
  else {
    non_existing_opendir_cb_cold_1();
LAB_0015a954:
    non_existing_opendir_cb_cold_2();
LAB_0015a959:
    non_existing_opendir_cb_cold_3();
  }
  non_existing_opendir_cb_cold_4();
  memset(&opendir_req,0xdb,0x1b8);
  puVar2 = (uv_fs_t *)uv_default_loop();
  iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test/fixtures/empty_file",0);
  if (iVar1 == -0x14) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015aa6d;
    if (opendir_req.result != -0x14) goto LAB_0015aa72;
    if (opendir_req.ptr != (void *)0x0) goto LAB_0015aa77;
    uv_fs_req_cleanup(&opendir_req);
    memset(&opendir_req,0xdb,0x1b8);
    puVar2 = (uv_fs_t *)uv_default_loop();
    iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test/fixtures/empty_file",file_opendir_cb);
    if (iVar1 != 0) goto LAB_0015aa7c;
    if (file_opendir_cb_count != 0) goto LAB_0015aa81;
    puVar2 = (uv_fs_t *)uv_default_loop();
    iVar1 = uv_run(puVar2,0);
    if (iVar1 != 0) goto LAB_0015aa86;
    if (file_opendir_cb_count != 1) goto LAB_0015aa8b;
    puVar3 = (uv_fs_t *)uv_default_loop();
    uv_walk(puVar3,close_walk_cb,0);
    uv_run(puVar3,0);
    puVar2 = (uv_fs_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    run_test_fs_readdir_file_cold_1();
LAB_0015aa6d:
    run_test_fs_readdir_file_cold_2();
LAB_0015aa72:
    run_test_fs_readdir_file_cold_3();
LAB_0015aa77:
    run_test_fs_readdir_file_cold_4();
LAB_0015aa7c:
    run_test_fs_readdir_file_cold_5();
LAB_0015aa81:
    run_test_fs_readdir_file_cold_6();
LAB_0015aa86:
    run_test_fs_readdir_file_cold_7();
LAB_0015aa8b:
    puVar3 = &opendir_req;
    run_test_fs_readdir_file_cold_8();
  }
  run_test_fs_readdir_file_cold_9();
  if (puVar2 == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015aad8;
    if (opendir_req.result != -0x14) goto LAB_0015aadd;
    if (opendir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&opendir_req);
      file_opendir_cb_count = file_opendir_cb_count + 1;
      return;
    }
  }
  else {
    file_opendir_cb_cold_1();
LAB_0015aad8:
    file_opendir_cb_cold_2();
LAB_0015aadd:
    file_opendir_cb_cold_3();
  }
  file_opendir_cb_cold_4();
  puStack_738 = (uv_fs_t *)0x15aafd;
  puStack_48 = puVar3;
  cleanup_test_files();
  puStack_738 = (uv_fs_t *)0x15ab02;
  uVar4 = uv_default_loop();
  puStack_738 = (uv_fs_t *)0x15ab21;
  iVar1 = uv_fs_mkdir(uVar4,auStack_3b8,"test_dir",0x1ed,0);
  if (iVar1 == 0) {
    puStack_738 = (uv_fs_t *)0x15ab2e;
    uVar4 = uv_default_loop();
    puStack_738 = (uv_fs_t *)0x15ab53;
    iVar1 = uv_fs_open(uVar4,&uStack_570,"test_dir/file1",0x41,0x180,0);
    puVar2 = puVar3;
    if (iVar1 < 0) goto LAB_0015aef9;
    puVar2 = &uStack_570;
    puStack_738 = (uv_fs_t *)0x15ab6b;
    uv_fs_req_cleanup(puVar2);
    puStack_738 = (uv_fs_t *)0x15ab70;
    uVar4 = uv_default_loop();
    puStack_738 = (uv_fs_t *)0x15ab82;
    iVar1 = uv_fs_close(uVar4,auStack_728,(undefined4)uStack_570.result,0);
    if (iVar1 != 0) goto LAB_0015aefe;
    puStack_738 = (uv_fs_t *)0x15ab94;
    uv_fs_req_cleanup(auStack_728);
    puStack_738 = (uv_fs_t *)0x15ab99;
    uVar4 = uv_default_loop();
    puStack_738 = (uv_fs_t *)0x15abbe;
    iVar1 = uv_fs_open(uVar4,&uStack_570,"test_dir/file2",0x41,0x180,0);
    if (iVar1 < 0) goto LAB_0015af03;
    puVar2 = &uStack_570;
    puStack_738 = (uv_fs_t *)0x15abd6;
    uv_fs_req_cleanup(puVar2);
    puStack_738 = (uv_fs_t *)0x15abdb;
    uVar4 = uv_default_loop();
    puStack_738 = (uv_fs_t *)0x15abed;
    iVar1 = uv_fs_close(uVar4,auStack_728,(undefined4)uStack_570.result,0);
    if (iVar1 != 0) goto LAB_0015af08;
    puStack_738 = (uv_fs_t *)0x15abff;
    uv_fs_req_cleanup(auStack_728);
    puStack_738 = (uv_fs_t *)0x15ac04;
    uVar4 = uv_default_loop();
    puStack_738 = (uv_fs_t *)0x15ac23;
    iVar1 = uv_fs_mkdir(uVar4,auStack_3b8,"test_dir/test_subdir",0x1ed,0);
    if (iVar1 != 0) goto LAB_0015af0d;
    puStack_738 = (uv_fs_t *)0x15ac38;
    uv_fs_req_cleanup(auStack_3b8);
    puVar2 = &opendir_req;
    puStack_738 = (uv_fs_t *)0x15ac51;
    memset(&opendir_req,0xdb,0x1b8);
    puStack_738 = (uv_fs_t *)0x15ac56;
    uVar4 = uv_default_loop();
    puStack_738 = (uv_fs_t *)0x15ac6a;
    iVar1 = uv_fs_opendir(uVar4,&opendir_req,"test_dir",0);
    puVar3 = (uv_fs_t *)opendir_req.ptr;
    if (iVar1 != 0) goto LAB_0015af12;
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015af17;
    if (opendir_req.result != 0) goto LAB_0015af1c;
    if (opendir_req.ptr == (void *)0x0) goto LAB_0015af21;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)puVar3 + 8) = 1;
    puStack_738 = (uv_fs_t *)0x15acbb;
    uv_fs_req_cleanup(&opendir_req);
    puStack_738 = (uv_fs_t *)0x15acc0;
    uVar4 = uv_default_loop();
    puStack_738 = (uv_fs_t *)0x15acd4;
    iVar1 = uv_fs_readdir(uVar4,&readdir_req,puVar3,0);
    if (iVar1 == 0) {
LAB_0015aeef:
      puStack_738 = (uv_fs_t *)0x15aef4;
      run_test_fs_readdir_non_empty_dir_cold_21();
      goto LAB_0015aef4;
    }
    lVar5 = 3;
    do {
      __s1 = dirents[0].name;
      puStack_738 = (uv_fs_t *)0x15ad09;
      iVar1 = strcmp(dirents[0].name,"file1");
      if (iVar1 != 0) {
        puStack_738 = (uv_fs_t *)0x15ad1c;
        iVar1 = strcmp(__s1,"file2");
        if (iVar1 == 0) goto LAB_0015ad33;
        puStack_738 = (uv_fs_t *)0x15ad2b;
        iVar1 = strcmp(__s1,"test_subdir");
        if (iVar1 == 0) goto LAB_0015ad33;
LAB_0015aee5:
        puStack_738 = (uv_fs_t *)0x15aeea;
        run_test_fs_readdir_non_empty_dir_cold_10();
LAB_0015aeea:
        puStack_738 = (uv_fs_t *)0x15aeef;
        run_test_fs_readdir_non_empty_dir_cold_12();
        goto LAB_0015aeef;
      }
LAB_0015ad33:
      puStack_738 = (uv_fs_t *)0x15ad3e;
      iVar1 = strcmp(__s1,"test_subdir");
      if (iVar1 == 0) {
        if (dirents[0].type == UV_DIRENT_DIR) goto LAB_0015ad5b;
        goto LAB_0015aeea;
      }
      if (dirents[0].type != UV_DIRENT_FILE) {
        puStack_738 = (uv_fs_t *)0x15aee5;
        run_test_fs_readdir_non_empty_dir_cold_11();
        goto LAB_0015aee5;
      }
LAB_0015ad5b:
      puStack_738 = (uv_fs_t *)0x15ad63;
      uv_fs_req_cleanup(&readdir_req);
      puStack_738 = (uv_fs_t *)0x15ad68;
      uVar4 = uv_default_loop();
      puStack_738 = (uv_fs_t *)0x15ad78;
      iVar1 = uv_fs_readdir(uVar4,&readdir_req,puVar3,0);
      lVar5 = lVar5 + -1;
    } while (iVar1 != 0);
    if (lVar5 != 0) goto LAB_0015aeef;
    puStack_738 = (uv_fs_t *)0x15ad98;
    uv_fs_req_cleanup(&readdir_req);
    puStack_738 = (uv_fs_t *)0x15adb1;
    memset(&closedir_req,0xdb,0x1b8);
    puStack_738 = (uv_fs_t *)0x15adb6;
    uVar4 = uv_default_loop();
    puStack_738 = (uv_fs_t *)0x15adc6;
    uv_fs_closedir(uVar4,&closedir_req,puVar3,0);
    if (closedir_req.result != 0) goto LAB_0015af26;
    puStack_738 = (uv_fs_t *)0x15ade0;
    uv_fs_req_cleanup(&closedir_req);
    puVar3 = &opendir_req;
    puStack_738 = (uv_fs_t *)0x15adf9;
    memset(&opendir_req,0xdb,0x1b8);
    puStack_738 = (uv_fs_t *)0x15adfe;
    uVar4 = uv_default_loop();
    puStack_738 = (uv_fs_t *)0x15ae17;
    iVar1 = uv_fs_opendir(uVar4,&opendir_req,"test_dir",non_empty_opendir_cb);
    if (iVar1 != 0) goto LAB_0015af2b;
    if (non_empty_opendir_cb_count != 0) goto LAB_0015af30;
    if (non_empty_closedir_cb_count != 0) goto LAB_0015af35;
    puStack_738 = (uv_fs_t *)0x15ae3e;
    uVar4 = uv_default_loop();
    puStack_738 = (uv_fs_t *)0x15ae48;
    iVar1 = uv_run(uVar4,0);
    if (iVar1 != 0) goto LAB_0015af3a;
    if (non_empty_opendir_cb_count != 1) goto LAB_0015af3f;
    if (non_empty_closedir_cb_count == 1) {
      puStack_738 = (uv_fs_t *)0x15ae6f;
      uVar4 = uv_default_loop();
      puStack_738 = (uv_fs_t *)0x15ae8b;
      uv_fs_rmdir(uVar4,auStack_200,"test_subdir",0);
      puStack_738 = (uv_fs_t *)0x15ae93;
      uv_fs_req_cleanup(auStack_200);
      puStack_738 = (uv_fs_t *)0x15ae98;
      cleanup_test_files();
      puStack_738 = (uv_fs_t *)0x15ae9d;
      puVar3 = (uv_fs_t *)uv_default_loop();
      puStack_738 = (uv_fs_t *)0x15aeb1;
      uv_walk(puVar3,close_walk_cb,0);
      puStack_738 = (uv_fs_t *)0x15aebb;
      uv_run(puVar3,0);
      puStack_738 = (uv_fs_t *)0x15aec0;
      uVar4 = uv_default_loop();
      puStack_738 = (uv_fs_t *)0x15aec8;
      iVar1 = uv_loop_close(uVar4);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_0015af49;
    }
  }
  else {
LAB_0015aef4:
    puStack_738 = (uv_fs_t *)0x15aef9;
    run_test_fs_readdir_non_empty_dir_cold_1();
    puVar2 = puVar3;
LAB_0015aef9:
    puStack_738 = (uv_fs_t *)0x15aefe;
    run_test_fs_readdir_non_empty_dir_cold_2();
LAB_0015aefe:
    puStack_738 = (uv_fs_t *)0x15af03;
    run_test_fs_readdir_non_empty_dir_cold_3();
LAB_0015af03:
    puStack_738 = (uv_fs_t *)0x15af08;
    run_test_fs_readdir_non_empty_dir_cold_4();
LAB_0015af08:
    puStack_738 = (uv_fs_t *)0x15af0d;
    run_test_fs_readdir_non_empty_dir_cold_5();
LAB_0015af0d:
    puStack_738 = (uv_fs_t *)0x15af12;
    run_test_fs_readdir_non_empty_dir_cold_6();
LAB_0015af12:
    puStack_738 = (uv_fs_t *)0x15af17;
    run_test_fs_readdir_non_empty_dir_cold_7();
LAB_0015af17:
    puStack_738 = (uv_fs_t *)0x15af1c;
    run_test_fs_readdir_non_empty_dir_cold_8();
LAB_0015af1c:
    puVar3 = puVar2;
    puStack_738 = (uv_fs_t *)0x15af21;
    run_test_fs_readdir_non_empty_dir_cold_9();
LAB_0015af21:
    puStack_738 = (uv_fs_t *)0x15af26;
    run_test_fs_readdir_non_empty_dir_cold_22();
LAB_0015af26:
    puStack_738 = (uv_fs_t *)0x15af2b;
    run_test_fs_readdir_non_empty_dir_cold_13();
LAB_0015af2b:
    puStack_738 = (uv_fs_t *)0x15af30;
    run_test_fs_readdir_non_empty_dir_cold_14();
LAB_0015af30:
    puStack_738 = (uv_fs_t *)0x15af35;
    run_test_fs_readdir_non_empty_dir_cold_15();
LAB_0015af35:
    puStack_738 = (uv_fs_t *)0x15af3a;
    run_test_fs_readdir_non_empty_dir_cold_16();
LAB_0015af3a:
    puStack_738 = (uv_fs_t *)0x15af3f;
    run_test_fs_readdir_non_empty_dir_cold_17();
LAB_0015af3f:
    puStack_738 = (uv_fs_t *)0x15af44;
    run_test_fs_readdir_non_empty_dir_cold_18();
  }
  puStack_738 = (uv_fs_t *)0x15af49;
  run_test_fs_readdir_non_empty_dir_cold_19();
LAB_0015af49:
  puStack_738 = (uv_fs_t *)cleanup_test_files;
  run_test_fs_readdir_non_empty_dir_cold_20();
  puStack_738 = puVar3;
  uv_fs_unlink(0,auStack_8f0,"test_dir/file1",0);
  uv_fs_req_cleanup(auStack_8f0);
  uv_fs_unlink(0,auStack_8f0,"test_dir/file2",0);
  uv_fs_req_cleanup(auStack_8f0);
  uv_fs_rmdir(0,auStack_8f0,"test_dir/test_subdir",0);
  uv_fs_req_cleanup(auStack_8f0);
  uv_fs_rmdir(0,auStack_8f0,"test_dir",0);
  uv_fs_req_cleanup(auStack_8f0);
  return;
}

Assistant:

static void non_existing_opendir_cb(uv_fs_t* req) {
  ASSERT(req == &opendir_req);
  ASSERT(req->fs_type == UV_FS_OPENDIR);
  ASSERT(req->result == UV_ENOENT);
  ASSERT(req->ptr == NULL);

  uv_fs_req_cleanup(req);
  ++non_existing_opendir_cb_count;
}